

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O1

void __thiscall cppforth::Forth::writeFile(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint src;
  string fileData;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  string local_58;
  long *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  requireDStackDepth(this,3,"WRITE-FILE");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"WRITE-FILE","");
  GetFileHandle((Forth *)&local_38,(Cell)this,(string *)(ulong)uVar2,(errorCodes)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src = ForthStack<unsigned_int>::getTop(this_00);
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar1;
  moveFromDataSpace(this,&local_58,src,(ulong)uVar2);
  std::ios::clear((int)local_38 + (int)*(undefined8 *)(*local_38 + -0x18));
  std::ostream::write((char *)(local_38 + 2),(long)local_58._M_dataplus._M_p);
  ForthStack<unsigned_int>::setTop
            (this_00,-(*(uint *)((long)local_38 + *(long *)(*local_38 + -0x18) + 0x20) & 1) &
                     0xffffffb5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return;
}

Assistant:

void writeFile() {
	REQUIRE_DSTACK_DEPTH(3, "WRITE-FILE");
	auto h = (dStack.getTop()); pop();
	auto f = GetFileHandle(h, "WRITE-FILE", errorWriteFile);
	auto length = SIZE_T(dStack.getTop()); pop();
	auto caddr = dStack.getTop();
	std::string fileData{};
	moveFromDataSpace(fileData, caddr, length);
	f->clear();
	f->write(fileData.c_str(), static_cast<std::streamsize>(length));
	auto status = f->rdstate();
	dStack.setTop(f->bad() ? Cell(errorWriteFile) : 0);
}